

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O2

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunCheckOutput(AV1CornerMatchTest *this)

{
  ACMRandom *this_00;
  bool bVar1;
  AV1CornerMatchTest *pAVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ParamType *pPVar7;
  int iVar8;
  pointer *__ptr;
  SEARCH_METHODS *pSVar9;
  int y;
  int x;
  int y_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertionResult gtest_ar;
  AssertHelper local_b0;
  bool simd_valid2;
  bool simd_valid1;
  bool c_valid2;
  bool c_valid1;
  double c_mean1;
  double c_one_over_stddev1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input1;
  double c_one_over_stddev2;
  double c_mean2;
  int local_6c;
  AV1CornerMatchTest *local_68;
  double simd_corr;
  double c_corr;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  
  input1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  input2._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  c_mean1 = 0.0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&gtest_ar,"input1","nullptr",&input1,(void **)&c_mean1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&c_mean1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_one_over_stddev1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x5b,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_one_over_stddev1,(Message *)&c_mean1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_one_over_stddev1);
    if (c_mean1 != 0.0) {
      (**(code **)(*(long *)c_mean1 + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    c_mean1 = 0.0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              ((internal *)&gtest_ar,"input2","nullptr",&input2,(void **)&c_mean1);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pPVar7 = testing::
               WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
               ::GetParam();
      GenerateInput(this,(uint8_t *)
                         input1._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                    (uint8_t *)
                    input2._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x80,0x80,
                    (pPVar7->
                    super__Tuple_impl<0UL,_int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                    ).super__Head_base<0UL,_int,_false>._M_head_impl);
      this_00 = &this->rnd_;
      iVar8 = 0x3e9;
      local_68 = this;
      do {
        if (iVar8 + -1 == 0) break;
        uVar3 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar4 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar6 = testing::internal::Random::Generate(&this_00->random_,0x71);
        x = uVar3 + 7;
        y_00 = uVar4 + 7;
        local_6c = iVar8 + -1;
        c_valid1 = aom_compute_mean_stddev_c
                             ((uchar *)input1._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                              0x80,x,y_00,&c_mean1,&c_one_over_stddev1);
        iVar8 = uVar5 + 7;
        y = uVar6 + 7;
        c_valid2 = aom_compute_mean_stddev_c
                             ((uchar *)input2._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                              0x80,iVar8,y,&c_mean2,&c_one_over_stddev2);
        pAVar2 = local_68;
        simd_valid1 = (*local_68->target_compute_mean_stddev_func)
                                ((uchar *)input1._M_t.
                                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                          .super__Head_base<0UL,_unsigned_char_*,_false>.
                                          _M_head_impl,0x80,x,y_00,&simd_mean1,
                                 &simd_one_over_stddev1);
        simd_valid2 = (*pAVar2->target_compute_mean_stddev_func)
                                ((uchar *)input2._M_t.
                                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                          .super__Head_base<0UL,_unsigned_char_*,_false>.
                                          _M_head_impl,0x80,iVar8,y,&simd_mean2,
                                 &simd_one_over_stddev2);
        c_corr = aom_compute_correlation_c
                           ((uchar *)input1._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                            0x80,x,y_00,c_mean1,c_one_over_stddev1,
                            (uchar *)input2._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                            0x80,iVar8,y,c_mean2,c_one_over_stddev2);
        simd_corr = (*local_68->target_compute_corr_func)
                              ((uchar *)input1._M_t.
                                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                               0x80,x,y_00,c_mean1,c_one_over_stddev1,
                               (uchar *)input2._M_t.
                                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                               0x80,iVar8,y,c_mean2,c_one_over_stddev2);
        iVar8 = local_6c;
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)&gtest_ar,"simd_valid1","c_valid1",&simd_valid1,&c_valid1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x83,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)&gtest_ar,"simd_valid2","c_valid2",&simd_valid2,&c_valid2);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x84,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"simd_mean1","c_mean1",&simd_mean1,&c_mean1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x85,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"simd_one_over_stddev1","c_one_over_stddev1",
                   &simd_one_over_stddev1,&c_one_over_stddev1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x86,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"simd_mean2","c_mean2",&simd_mean2,&c_mean2);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x87,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"simd_one_over_stddev2","c_one_over_stddev2",
                   &simd_one_over_stddev2,&c_one_over_stddev2);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x88,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          goto LAB_003e8fa9;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"simd_corr","c_corr",&simd_corr,&c_corr);
        bVar1 = gtest_ar.success_;
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          pSVar9 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar9 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x89,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
      } while (bVar1 != false);
      goto LAB_003e8fae;
    }
    testing::Message::Message((Message *)&c_mean1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_one_over_stddev1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x5c,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_one_over_stddev1,(Message *)&c_mean1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_one_over_stddev1);
    if (c_mean1 != 0.0) {
      (**(code **)(*(long *)c_mean1 + 8))();
    }
  }
LAB_003e8fa9:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_003e8fae:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&input2);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&input1);
  return;
}

Assistant:

void AV1CornerMatchTest::RunCheckOutput() {
  const int w = 128, h = 128;
  const int num_iters = 1000;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  for (int i = 0; i < num_iters; ++i) {
    int x1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);
    int x2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);

    double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
    bool c_valid1 = aom_compute_mean_stddev_c(input1.get(), w, x1, y1, &c_mean1,
                                              &c_one_over_stddev1);
    bool c_valid2 = aom_compute_mean_stddev_c(input2.get(), w, x2, y2, &c_mean2,
                                              &c_one_over_stddev2);

    double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
    bool simd_valid1 = target_compute_mean_stddev_func(
        input1.get(), w, x1, y1, &simd_mean1, &simd_one_over_stddev1);
    bool simd_valid2 = target_compute_mean_stddev_func(
        input2.get(), w, x2, y2, &simd_mean2, &simd_one_over_stddev2);

    // Run the correlation calculation even if one of the "valid" flags is
    // false, i.e. if one of the patches doesn't have enough variance. This is
    // safe because any potential division by 0 is caught in
    // aom_compute_mean_stddev(), and one_over_stddev is set to 0 instead.
    // This causes aom_compute_correlation() to return 0, without causing a
    // division by 0.
    const double c_corr = aom_compute_correlation_c(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);
    const double simd_corr = target_compute_corr_func(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);

    ASSERT_EQ(simd_valid1, c_valid1);
    ASSERT_EQ(simd_valid2, c_valid2);
    ASSERT_EQ(simd_mean1, c_mean1);
    ASSERT_EQ(simd_one_over_stddev1, c_one_over_stddev1);
    ASSERT_EQ(simd_mean2, c_mean2);
    ASSERT_EQ(simd_one_over_stddev2, c_one_over_stddev2);
    ASSERT_EQ(simd_corr, c_corr);
  }
}